

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.h
# Opt level: O2

void __thiscall
mp::
FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
::RedefineVariable<mp::LinearFunctionalConstraint>
          (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
           *this,int res_var,LinearFunctionalConstraint *fc)

{
  uint uVar1;
  BasicConstraintKeeper *pBVar2;
  ConInfo *pCVar3;
  NodeRange NVar4;
  ConInfo ci;
  ConInfo local_e8;
  LinearFunctionalConstraint local_d8;
  
  pCVar3 = GetInitExpression(this,res_var);
  pBVar2 = pCVar3->pck_;
  uVar1 = pCVar3->index_;
  (fc->super_FunctionalConstraint).result_var_ = res_var;
  local_e8.index_ = MapFind__Impl<mp::LinearFunctionalConstraint>(this,fc);
  if (local_e8.index_ < 0) {
    LinearFunctionalConstraint::LinearFunctionalConstraint(&local_d8,fc);
    NVar4 = AddConstraint<mp::LinearFunctionalConstraint>(this,&local_d8);
    local_e8.index_ = NVar4.ir_.beg_;
    LinearFunctionalConstraint::~LinearFunctionalConstraint(&local_d8);
  }
  local_e8.pck_ = &(this->ck__LinearFunctionalConstraint_).super_BasicConstraintKeeper;
  ReplaceInitExpression(this,res_var,&local_e8);
  (*pBVar2->_vptr_BasicConstraintKeeper[0x1d])(pBVar2,(ulong)uVar1);
  return;
}

Assistant:

void RedefineVariable(int res_var, FuncConstraint&& fc) {
    assert( MPD( HasInitExpression(res_var) ) );
		auto ci_old = MPD( GetInitExpression(res_var) );
    fc.SetResultVar(res_var);
		// If this expression exists, use it.
		// TODO make sure any new context is re-converted
		// if necessary.
		auto i = MPD( MapFind(fc) );
    // TODO preprocess, try map again, and use the result.
		if (i<0)
      i = int( MPD( AddConstraint(std::move(fc)) ) );
		auto& ck = GET_CONSTRAINT_KEEPER( FuncConstraint );
    ConInfo ci{&ck, i};
    ReplaceInitExpression(res_var, ci);
    MarkAsBridged(ci_old);
  }